

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O0

bool Diligent::anon_unknown_174::VerifyPipelineStateUnpackInfo
               (PipelineStateUnpackInfo *DeArchiveInfo,IPipelineState **ppPSO)

{
  IPipelineState **ppPSO_local;
  PipelineStateUnpackInfo *DeArchiveInfo_local;
  
  return true;
}

Assistant:

bool VerifyPipelineStateUnpackInfo(const PipelineStateUnpackInfo& DeArchiveInfo, IPipelineState** ppPSO)
{
#define CHECK_UNPACK_PSO_PARAM(Expr, ...) CHECK_UNPACK_PARAMATER("Invalid PSO unpack parameter: ", ##__VA_ARGS__)
    CHECK_UNPACK_PSO_PARAM(ppPSO != nullptr, "ppPSO must not be null");
    CHECK_UNPACK_PSO_PARAM(DeArchiveInfo.pArchive != nullptr, "pArchive must not be null");
    CHECK_UNPACK_PSO_PARAM(DeArchiveInfo.Name != nullptr, "Name must not be null");
    CHECK_UNPACK_PSO_PARAM(DeArchiveInfo.pDevice != nullptr, "pDevice must not be null");
    CHECK_UNPACK_PSO_PARAM(DeArchiveInfo.PipelineType <= PIPELINE_TYPE_LAST, "PipelineType must be valid");
#undef CHECK_UNPACK_PSO_PARAM

    return true;
}